

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

bool __thiscall QUrl::matches(QUrl *this,QUrl *url,FormattingOptions options)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  QUrlPrivate *pQVar6;
  QUrlPrivate *this_00;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  pQVar6 = url->d;
  bVar4 = true;
  if (this_00 == (QUrlPrivate *)0x0 && pQVar6 == (QUrlPrivate *)0x0) goto LAB_0025dc6d;
  if (this_00 == (QUrlPrivate *)0x0) {
    bVar4 = false;
    if ((pQVar6->sectionIsPresent != '\0') || (pQVar6->port != -1)) goto LAB_0025dc6d;
    lVar1 = (pQVar6->path).d.size;
  }
  else {
    if (pQVar6 != (QUrlPrivate *)0x0) {
      cVar2 = ((this_00->flags & 1) == 0) * '\b';
      bVar5 = cVar2 - 9;
      if ((options.i & 1U) == 0) {
        lVar1 = (this_00->scheme).d.size;
        if ((lVar1 == (pQVar6->scheme).d.size) &&
           (rhs.m_data = (pQVar6->scheme).d.ptr, rhs.m_size = lVar1,
           lhs.m_data = (this_00->scheme).d.ptr, lhs.m_size = lVar1,
           bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)) goto LAB_0025db15;
      }
      else {
        bVar5 = cVar2 - 10;
LAB_0025db15:
        if ((options.i & 2U) == 0) {
          lVar1 = (this_00->password).d.size;
          if ((lVar1 != (pQVar6->password).d.size) ||
             (rhs_00.m_data = (pQVar6->password).d.ptr, rhs_00.m_size = lVar1,
             lhs_00.m_data = (this_00->password).d.ptr, lhs_00.m_size = lVar1,
             bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00), !bVar3)) goto LAB_0025dc6b;
        }
        else {
          bVar5 = bVar5 & 0xfb;
        }
        if ((~options.i & 6U) == 0) {
          bVar5 = bVar5 & 0xfd;
        }
        else {
          lVar1 = (this_00->userName).d.size;
          if ((lVar1 != (pQVar6->userName).d.size) ||
             (rhs_01.m_data = (pQVar6->userName).d.ptr, rhs_01.m_size = lVar1,
             lhs_01.m_data = (this_00->userName).d.ptr, lhs_01.m_size = lVar1,
             bVar3 = QtPrivate::equalStrings(lhs_01,rhs_01), !bVar3)) goto LAB_0025dc6b;
        }
        if ((options.i & 8U) == 0) {
          if (this_00->port != pQVar6->port) goto LAB_0025dc6b;
        }
        else {
          bVar5 = bVar5 & 0xef;
        }
        if ((~options.i & 0x1eU) == 0) {
          bVar5 = bVar5 & 0xf7;
        }
        else {
          lVar1 = (this_00->host).d.size;
          if ((lVar1 != (pQVar6->host).d.size) ||
             (rhs_03.m_data = (pQVar6->host).d.ptr, rhs_03.m_size = lVar1,
             lhs_03.m_data = (this_00->host).d.ptr, lhs_03.m_size = lVar1,
             bVar3 = QtPrivate::equalStrings(lhs_03,rhs_03), !bVar3)) goto LAB_0025dc6b;
        }
        if ((options.i & 0x40U) == 0) {
          lVar1 = (this_00->query).d.size;
          if ((lVar1 != (pQVar6->query).d.size) ||
             (rhs_02.m_data = (pQVar6->query).d.ptr, rhs_02.m_size = lVar1,
             lhs_02.m_data = (this_00->query).d.ptr, lhs_02.m_size = lVar1,
             bVar3 = QtPrivate::equalStrings(lhs_02,rhs_02), !bVar3)) goto LAB_0025dc6b;
        }
        else {
          bVar5 = bVar5 & 0xbf;
        }
        if ((char)options.i < '\0') {
          bVar5 = bVar5 & 0x7f;
        }
        else {
          bVar3 = ::operator!=(&this_00->fragment,&pQVar6->fragment);
          if (bVar3) goto LAB_0025dc6b;
          this_00 = this->d;
          pQVar6 = url->d;
        }
        if ((bVar5 & (pQVar6->sectionIsPresent ^ this_00->sectionIsPresent)) == 0) {
          if ((options.i & 0x20U) == 0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (storage_type_conflict *)0x0;
            local_58.d.size = 0;
            QUrlPrivate::appendPath(this_00,&local_58,options,Path);
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = (storage_type_conflict *)0x0;
            local_78.d.size = 0;
            QUrlPrivate::appendPath(url->d,&local_78,options,Path);
            if (local_58.d.size == local_78.d.size) {
              rhs_04.m_data = local_78.d.ptr;
              rhs_04.m_size = local_58.d.size;
              lhs_04.m_data = local_58.d.ptr;
              lhs_04.m_size = local_58.d.size;
              bVar4 = QtPrivate::equalStrings(lhs_04,rhs_04);
            }
            else {
              bVar4 = false;
            }
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          goto LAB_0025dc6d;
        }
      }
LAB_0025dc6b:
      bVar4 = false;
      goto LAB_0025dc6d;
    }
    bVar4 = false;
    if ((this_00->sectionIsPresent != '\0') || (this_00->port != -1)) goto LAB_0025dc6d;
    lVar1 = (this_00->path).d.size;
  }
  bVar4 = lVar1 == 0;
LAB_0025dc6d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QUrl::matches(const QUrl &url, FormattingOptions options) const
{
    if (!d && !url.d)
        return true;
    if (!d)
        return url.d->isEmpty();
    if (!url.d)
        return d->isEmpty();

    // First, compare which sections are present, since it speeds up the
    // processing considerably. We just have to ignore the host-is-present flag
    // for local files (the "file" protocol), due to the requirements of the
    // XDG file URI specification.
    int mask = QUrlPrivate::FullUrl;
    if (isLocalFile())
        mask &= ~QUrlPrivate::Host;

    if (options.testFlag(QUrl::RemoveScheme))
        mask &= ~QUrlPrivate::Scheme;
    else if (d->scheme != url.d->scheme)
        return false;

    if (options.testFlag(QUrl::RemovePassword))
        mask &= ~QUrlPrivate::Password;
    else if (d->password != url.d->password)
        return false;

    if (options.testFlag(QUrl::RemoveUserInfo))
        mask &= ~QUrlPrivate::UserName;
    else if (d->userName != url.d->userName)
        return false;

    if (options.testFlag(QUrl::RemovePort))
        mask &= ~QUrlPrivate::Port;
    else if (d->port != url.d->port)
        return false;

    if (options.testFlag(QUrl::RemoveAuthority))
        mask &= ~QUrlPrivate::Host;
    else if (d->host != url.d->host)
        return false;

    if (options.testFlag(QUrl::RemoveQuery))
        mask &= ~QUrlPrivate::Query;
    else if (d->query != url.d->query)
        return false;

    if (options.testFlag(QUrl::RemoveFragment))
        mask &= ~QUrlPrivate::Fragment;
    else if (d->fragment != url.d->fragment)
        return false;

    if ((d->sectionIsPresent & mask) != (url.d->sectionIsPresent & mask))
        return false;

    if (options.testFlag(QUrl::RemovePath))
        return true;

    // Compare paths, after applying path-related options
    QString path1;
    d->appendPath(path1, options, QUrlPrivate::Path);
    QString path2;
    url.d->appendPath(path2, options, QUrlPrivate::Path);
    return path1 == path2;
}